

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CGUITabControl.cpp
# Opt level: O3

void __thiscall irr::gui::CGUITabControl::~CGUITabControl(CGUITabControl *this,void **vtt)

{
  int *piVar1;
  code *pcVar2;
  void *pvVar3;
  IGUITab *pIVar4;
  long lVar5;
  IGUIButton *pIVar6;
  _func_int *p_Var7;
  pointer ppIVar8;
  pointer ppIVar9;
  ulong uVar10;
  
  pvVar3 = *vtt;
  *(void **)this = pvVar3;
  *(void **)(&this->field_0x0 + *(long *)((long)pvVar3 + -0x18)) = vtt[5];
  ppIVar8 = (this->Tabs).m_data.
            super__Vector_base<irr::gui::IGUITab_*,_std::allocator<irr::gui::IGUITab_*>_>._M_impl.
            super__Vector_impl_data._M_start;
  ppIVar9 = (this->Tabs).m_data.
            super__Vector_base<irr::gui::IGUITab_*,_std::allocator<irr::gui::IGUITab_*>_>._M_impl.
            super__Vector_impl_data._M_finish;
  if ((int)((ulong)((long)ppIVar9 - (long)ppIVar8) >> 3) != 0) {
    uVar10 = 0;
    do {
      pIVar4 = ppIVar8[uVar10];
      if (pIVar4 != (IGUITab *)0x0) {
        lVar5 = *(long *)(*(long *)&(pIVar4->super_IGUIElement).super_IEventReceiver + -0x18);
        piVar1 = (int *)((long)&(pIVar4->super_IGUIElement).Children + lVar5 + 8U);
        *piVar1 = *piVar1 + -1;
        if (*piVar1 == 0) {
          (**(code **)(*(long *)((long)&(pIVar4->super_IGUIElement).super_IEventReceiver + lVar5) +
                      8))();
          ppIVar8 = (this->Tabs).m_data.
                    super__Vector_base<irr::gui::IGUITab_*,_std::allocator<irr::gui::IGUITab_*>_>.
                    _M_impl.super__Vector_impl_data._M_start;
          ppIVar9 = (this->Tabs).m_data.
                    super__Vector_base<irr::gui::IGUITab_*,_std::allocator<irr::gui::IGUITab_*>_>.
                    _M_impl.super__Vector_impl_data._M_finish;
        }
      }
      uVar10 = uVar10 + 1;
    } while (uVar10 < ((ulong)((long)ppIVar9 - (long)ppIVar8) >> 3 & 0xffffffff));
  }
  pIVar6 = this->UpButton;
  if (pIVar6 != (IGUIButton *)0x0) {
    p_Var7 = (pIVar6->super_IGUIElement).super_IEventReceiver._vptr_IEventReceiver[-3];
    pcVar2 = p_Var7 + 8 +
             (long)&(pIVar6->super_IGUIElement).Children.
                    super__List_base<irr::gui::IGUIElement_*,_std::allocator<irr::gui::IGUIElement_*>_>
    ;
    *(int *)pcVar2 = *(int *)pcVar2 + -1;
    if (*(int *)pcVar2 == 0) {
      (**(code **)(*(long *)(p_Var7 + (long)&(pIVar6->super_IGUIElement).super_IEventReceiver.
                                             _vptr_IEventReceiver) + 8))();
    }
  }
  pIVar6 = this->DownButton;
  if (pIVar6 != (IGUIButton *)0x0) {
    p_Var7 = (pIVar6->super_IGUIElement).super_IEventReceiver._vptr_IEventReceiver[-3];
    pcVar2 = p_Var7 + 8 +
             (long)&(pIVar6->super_IGUIElement).Children.
                    super__List_base<irr::gui::IGUIElement_*,_std::allocator<irr::gui::IGUIElement_*>_>
    ;
    *(int *)pcVar2 = *(int *)pcVar2 + -1;
    if (*(int *)pcVar2 == 0) {
      (**(code **)(*(long *)(p_Var7 + (long)&(pIVar6->super_IGUIElement).super_IEventReceiver.
                                             _vptr_IEventReceiver) + 8))();
    }
  }
  ppIVar8 = (this->Tabs).m_data.
            super__Vector_base<irr::gui::IGUITab_*,_std::allocator<irr::gui::IGUITab_*>_>._M_impl.
            super__Vector_impl_data._M_start;
  if (ppIVar8 != (pointer)0x0) {
    operator_delete(ppIVar8,(long)(this->Tabs).m_data.
                                  super__Vector_base<irr::gui::IGUITab_*,_std::allocator<irr::gui::IGUITab_*>_>
                                  ._M_impl.super__Vector_impl_data._M_end_of_storage - (long)ppIVar8
                   );
  }
  IGUIElement::~IGUIElement((IGUIElement *)this,vtt + 2);
  return;
}

Assistant:

CGUITabControl::~CGUITabControl()
{
	for (u32 i = 0; i < Tabs.size(); ++i) {
		if (Tabs[i])
			Tabs[i]->drop();
	}

	if (UpButton)
		UpButton->drop();

	if (DownButton)
		DownButton->drop();
}